

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O2

void __thiscall
flatbuffers::vector_downward<unsigned_int>::clear(vector_downward<unsigned_int> *this)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  
  puVar1 = this->buf_;
  if (puVar1 == (uint8_t *)0x0) {
    this->reserved_ = 0;
    puVar2 = (uint8_t *)0x0;
  }
  else {
    puVar2 = puVar1 + this->reserved_;
  }
  this->cur_ = puVar2;
  this->size_ = 0;
  this->scratch_ = puVar1;
  return;
}

Assistant:

void clear() {
    if (buf_) {
      cur_ = buf_ + reserved_;
    } else {
      reserved_ = 0;
      cur_ = nullptr;
    }
    size_ = 0;
    clear_scratch();
  }